

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

bool __thiscall
Memory::HeapBlockMap64::EnsureHeapBlock(HeapBlockMap64 *this,void *address,size_t pageCount)

{
  bool bVar1;
  uint uVar2;
  Node *pNVar3;
  Node *node;
  size_t sStack_38;
  uint nodePages;
  size_t pageCountLeft;
  uint lowerBitsAddress;
  size_t pageCount_local;
  void *address_local;
  HeapBlockMap64 *this_local;
  
  uVar2 = Math::PointerCastToIntegralTruncate<unsigned_int>(address);
  node._4_4_ = 0x100000 - (uVar2 >> 0xc);
  sStack_38 = pageCount;
  pageCount_local = (size_t)address;
  if (pageCount < node._4_4_) {
    node._4_4_ = (uint)pageCount;
  }
  while ((pNVar3 = FindOrInsertNode(this,(void *)pageCount_local), pNVar3 != (Node *)0x0 &&
         (bVar1 = HeapBlockMap32::EnsureHeapBlock(&pNVar3->map,(void *)pageCount_local,node._4_4_),
         bVar1))) {
    sStack_38 = sStack_38 - node._4_4_;
    if (sStack_38 == 0) {
      return true;
    }
    pageCount_local = pageCount_local + (ulong)node._4_4_ * 0x1000;
    node._4_4_ = 0x100000;
    if (sStack_38 < 0x100000) {
      node._4_4_ = (uint)sStack_38;
    }
  }
  return false;
}

Assistant:

bool
HeapBlockMap64::EnsureHeapBlock(void * address, size_t pageCount)
{
    uint lowerBitsAddress = ::Math::PointerCastToIntegralTruncate<uint>(address);
    size_t pageCountLeft = pageCount;
    uint nodePages = HeapBlockMap64::PagesPer4GB - lowerBitsAddress / AutoSystemInfo::PageSize;
    if (pageCountLeft < nodePages)
    {
        nodePages = (uint)pageCountLeft;
    }

    do
    {
        Node * node = FindOrInsertNode(address);
        if (node == nullptr || !node->map.EnsureHeapBlock(address, nodePages))
        {
            return false;
        }

        pageCountLeft -= nodePages;
        if (pageCountLeft == 0)
        {
            return true;
        }
        address = (void *)((size_t)address + ((size_t)nodePages * AutoSystemInfo::PageSize));
        nodePages = HeapBlockMap64::PagesPer4GB;
        if (pageCountLeft < HeapBlockMap64::PagesPer4GB)
        {
            nodePages = (uint)pageCountLeft;
        }
    }
    while (true);
}